

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_wc.c
# Opt level: O0

void func_exc_unpol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                   xc_mgga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tzk0;
  double t317;
  double t316;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t305;
  double t303;
  double t302;
  double t301;
  double t300;
  double t299;
  double t297;
  double t296;
  double t295;
  double t294;
  double t293;
  double t292;
  double t291;
  double t289;
  double t287;
  double t286;
  double t285;
  double t284;
  double t282;
  double t280;
  double t275;
  double t274;
  double t271;
  double t266;
  double t264;
  double t261;
  double t258;
  double t257;
  double t254;
  double t252;
  double t249;
  double t246;
  double t245;
  double t243;
  double t241;
  double t239;
  double t234;
  double t233;
  double t232;
  double t231;
  double t230;
  double t229;
  double t226;
  double t225;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t218;
  double t217;
  double t216;
  double t215;
  double t214;
  double t213;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t205;
  double t204;
  double t200;
  double t199;
  double t197;
  double t196;
  double t195;
  double t186;
  double t185;
  double t184;
  double t181;
  double t176;
  double t172;
  double t171;
  double t168;
  double t163;
  double t161;
  double t160;
  double t156;
  double t154;
  double t152;
  double t151;
  double t148;
  double t146;
  double t144;
  double t142;
  double t141;
  double t140;
  double t139;
  double t137;
  double t134;
  double t133;
  double t131;
  double t129;
  double t126;
  double t125;
  double t124;
  double t123;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t109;
  double t108;
  double t107;
  double t106;
  double t105;
  double t104;
  double t103;
  double t102;
  double t101;
  double t97;
  double t96;
  double t94;
  double t93;
  double t92;
  double t91;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t83;
  double t79;
  double t76;
  double t73;
  double t72;
  double t70;
  double t69;
  double t67;
  double t65;
  double t64;
  double t63;
  double t60;
  double t59;
  double t57;
  double t54;
  double t51;
  double t48;
  double t47;
  double t45;
  double t44;
  double t42;
  double t41;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t31;
  double t29;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t17;
  double t16;
  double t15;
  double t14;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double local_678;
  double local_668;
  double local_660;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  bool local_609;
  
  pdVar1 = (double *)in_RDI[0x2f];
  dVar4 = (double)(1.0 <= (double)in_RDI[0x31]);
  local_609 = *in_RDX / 2.0 <= (double)in_RDI[0x30] || dVar4 != 0.0;
  dVar5 = (double)local_609;
  dVar6 = cbrt(0.3183098861837907);
  dVar7 = dVar6 * 1.4422495703074083;
  dVar8 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_650 = cbrt((double)in_RDI[0x31]);
  local_678 = local_650 * (double)in_RDI[0x31];
  local_618 = local_678;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_618 = 2.5198420997897464;
  }
  dVar9 = cbrt(*in_RDX);
  dVar10 = cbrt(9.0);
  dVar11 = 1.0 / dVar9;
  local_620 = local_650;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_620 = 1.2599210498948732;
  }
  local_630 = (dVar10 * dVar10 * dVar6 * dVar6 * (double)in_RDI[4] * 1.4422495703074083 * dVar11 *
              (1.2599210498948732 / local_620)) / 18.0;
  bVar2 = 1.35 <= local_630;
  dVar8 = (double)(1.35 < local_630);
  local_628 = local_630;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_628 = 1.35;
  }
  local_628 = local_628 * local_628;
  dVar10 = local_628 * local_628;
  dVar12 = dVar10 * dVar10;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_630 = 1.35;
  }
  dVar8 = sqrt(3.141592653589793);
  dVar13 = erf((1.0 / local_630) / 2.0);
  dVar14 = exp(-(1.0 / (local_630 * local_630)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_638 = (((((((1.0 / local_628) / 36.0 - (1.0 / dVar10) / 960.0) +
                    (1.0 / (dVar10 * local_628)) / 26880.0) - (1.0 / dVar12) / 829440.0) +
                  ((1.0 / dVar12) / local_628) / 28385280.0) -
                 ((1.0 / dVar12) / dVar10) / 1073479680.0) +
                ((1.0 / dVar12) / (dVar10 * local_628)) / 44590694400.0) -
                (1.0 / (dVar12 * dVar12)) / 2021444812800.0;
  }
  else {
    local_638 = -(local_630 * 2.6666666666666665) *
                (local_630 * 2.0 *
                 (-(local_630 * local_630 * 2.0) * (dVar14 - 1.0) + (dVar14 - 1.5)) + dVar8 * dVar13
                ) + 1.0;
  }
  dVar8 = pdVar1[1];
  dVar10 = *in_RCX;
  dVar13 = *in_RDX * *in_RDX;
  dVar14 = dVar9 * dVar9;
  dVar15 = (1.0 / dVar14) / dVar13;
  dVar16 = dVar15 * 1.5874010519681996;
  dVar15 = *in_RCX * 1.5874010519681996 * dVar15;
  dVar12 = pdVar1[2];
  dVar17 = cbrt(9.869604401089358);
  dVar17 = dVar17 * dVar17 * 3.3019272488946267;
  dVar18 = dVar17 * 0.3;
  dVar19 = *in_R9 * 1.5874010519681996 * ((1.0 / dVar14) / *in_RDX);
  dVar20 = dVar18 - dVar19;
  dVar18 = dVar18 + dVar19;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_640 = 0.0;
  }
  else {
    local_640 = dVar7 * 2.519842099789747 * 1.2599210498948732 * -0.046875 * local_618 * dVar9 *
                local_638 *
                (dVar12 * dVar20 * (1.0 / dVar18) +
                dVar8 * dVar10 * 0.003840616724010807 * dVar16 *
                (1.0 / (dVar15 * 0.003840616724010807 + 1.0)) + *pdVar1);
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_648 = (double)in_RDI[0x31];
  }
  else {
    local_648 = 1.0;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_650 = 1.0 / local_650;
  }
  else {
    local_650 = 1.0;
  }
  dVar8 = dVar7 * 2.519842099789747 * dVar11 * 1.2599210498948732 * local_650;
  dVar10 = sqrt(dVar8);
  dVar12 = sqrt(dVar8);
  dVar12 = dVar8 * dVar12;
  dVar6 = dVar6 * dVar6 * 2.080083823051904;
  dVar21 = dVar6 * 1.5874010519681996 * (1.0 / dVar14) * 1.5874010519681996 * local_650 * local_650;
  dVar22 = log(16.081979498692537 /
               (dVar21 * 0.123235 + dVar12 * 0.204775 + dVar10 * 3.79785 + dVar8 * 0.8969) + 1.0);
  dVar22 = (dVar8 * 0.053425 + 1.0) * 0.0621814 * dVar22;
  local_660 = local_678;
  if ((double)in_RDI[0x31] < 0.0) {
    local_660 = 0.0;
  }
  dVar23 = ((local_618 + local_660) - 2.0) * 1.9236610509315362;
  dVar24 = log(32.16395899738507 /
               (dVar21 * 0.1562925 + dVar12 * 0.420775 + dVar10 * 7.05945 + dVar8 * 1.549425) + 1.0)
  ;
  dVar10 = log(29.608749977793437 /
               (dVar21 * 0.1241775 + dVar12 * 0.1100325 + dVar10 * 5.1785 + dVar8 * 0.905775) + 1.0)
  ;
  dVar10 = (dVar8 * 0.0278125 + 1.0) * dVar10;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_668 = 0.0;
  }
  else {
    local_668 = (local_648 *
                (dVar23 * 0.0197516734986138 * dVar10 +
                dVar23 * (dVar10 * -0.0197516734986138 +
                         (dVar8 * 0.05137 + 1.0) * -0.0310907 * dVar24 + dVar22) + -dVar22)) / 2.0;
  }
  dVar5 = pdVar1[3];
  dVar8 = *in_RCX;
  dVar23 = dVar15 * 0.46914023462026644 + 1.0;
  dVar10 = pdVar1[4];
  dVar12 = pdVar1[5];
  dVar24 = dVar20 * dVar20;
  dVar25 = dVar18 * dVar18;
  dVar21 = pdVar1[6];
  dVar26 = *in_RCX * *in_RCX;
  dVar26 = dVar26 * dVar26 * dVar26;
  dVar22 = dVar13 * dVar13 * dVar13 * dVar13;
  dVar27 = 1.0 / (dVar22 * dVar22);
  dVar28 = dVar23 * dVar23;
  dVar28 = (1.0 / (dVar28 * dVar28)) / dVar28;
  dVar22 = pdVar1[7];
  dVar11 = dVar7 * 2.519842099789747 * dVar11;
  dVar7 = sqrt(dVar11);
  dVar29 = sqrt(dVar11);
  dVar6 = dVar6 * 1.5874010519681996 * (1.0 / dVar14);
  dVar14 = log(16.081979498692537 /
               (dVar6 * 0.123235 + dVar11 * dVar29 * 0.204775 + dVar7 * 3.79785 + dVar11 * 0.8969) +
               1.0);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    local_678 = 1.0;
  }
  dVar29 = log(29.608749977793437 /
               (dVar6 * 0.1241775 + dVar11 * dVar29 * 0.1100325 + dVar7 * 5.1785 + dVar11 * 0.905775
               ) + 1.0);
  dVar4 = pdVar1[9];
  dVar19 = dVar17 * 0.6 * dVar19;
  dVar6 = *in_R9 * *in_R9 * 1.2599210498948732 * 4.0 * ((1.0 / dVar9) / (dVar13 * *in_RDX));
  dVar9 = dVar19 - dVar6;
  dVar9 = dVar9 * dVar9;
  dVar19 = dVar19 + dVar6;
  dVar19 = dVar19 * dVar19;
  dVar6 = pdVar1[10];
  dVar13 = dVar9 * dVar9 * dVar9;
  dVar17 = (1.0 / (dVar19 * dVar19)) / dVar19;
  dVar7 = pdVar1[0xb];
  dVar15 = cbrt(dVar15);
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_640 * 2.0 +
         local_668 * 2.0 *
         (dVar22 * dVar24 * dVar24 * (1.0 / (dVar25 * dVar25)) * 0.17058312527037534 * dVar26 *
          dVar27 * dVar28 +
         dVar21 * dVar26 * 0.17058312527037534 * dVar27 * dVar28 +
         dVar12 * dVar24 * (1.0 / dVar25) +
         dVar5 * dVar8 * 0.46914023462026644 * dVar16 * (1.0 / dVar23) +
         dVar10 * dVar20 * (1.0 / dVar18)) +
         (((dVar11 * 0.053425 + 1.0) * -0.0621814 * dVar14 +
          (local_678 + local_678 + -2.0) * 1.9236610509315362 * 0.0197516734986138 *
          (dVar11 * 0.0278125 + 1.0) * dVar29) - (local_668 + local_668)) *
         (pdVar1[0xc] * dVar9 * (1.0 / dVar19) * dVar15 +
          dVar7 * dVar13 * dVar17 * dVar15 +
          dVar4 * dVar9 * (1.0 / dVar19) + dVar6 * dVar13 * dVar17 + pdVar1[8]) +
         *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_exc_unpol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t2, t3, t4, t6, t7, t8, t10, t11;
  double t13, t15, t17, t18, t20, t21, t22, t23;
  double t24, t25, t26, t27, t28, t29, t30, t32;
  double t34, t36, t37, t39, t40, t43, t46, t47;
  double t49, t50, t52, t56, t57, t58, t61, t65;
  double tzk0;


  t2 = rho[0] / 0.2e1 <= p->dens_threshold;
  t3 = M_CBRT3;
  t4 = M_CBRTPI;
  t6 = t3 / t4;
  t7 = 0.1e1 <= p->zeta_threshold;
  t8 = p->zeta_threshold - 0.1e1;
  t10 = my_piecewise5(t7, t8, t7, -t8, 0);
  t11 = 0.1e1 + t10;
  t13 = POW_1_3(p->zeta_threshold);
  t15 = POW_1_3(t11);
  t17 = my_piecewise3(t11 <= p->zeta_threshold, t13 * p->zeta_threshold, t15 * t11);
  t18 = POW_1_3(rho[0]);
  t20 = M_CBRT6;
  t21 = M_PI * M_PI;
  t22 = POW_1_3(t21);
  t23 = t22 * t22;
  t24 = 0.1e1 / t23;
  t25 = t20 * t24;
  t26 = M_CBRT2;
  t27 = t26 * t26;
  t28 = sigma[0] * t27;
  t29 = rho[0] * rho[0];
  t30 = t18 * t18;
  t32 = 0.1e1 / t30 / t29;
  t34 = t25 * t28 * t32;
  t36 = t25 * sigma[0];
  t37 = t27 * t32;
  t39 = exp(-t34 / 0.24e2);
  t40 = t37 * t39;
  t43 = t20 * t20;
  t46 = t43 / t22 / t21;
  t47 = sigma[0] * sigma[0];
  t49 = t29 * t29;
  t50 = t49 * rho[0];
  t52 = 0.1e1 / t18 / t50;
  t56 = 0.1e1 + 0.27560657413756315278e-4 * t46 * t47 * t26 * t52;
  t57 = log(t56);
  t58 = 0.804e0 + 0.5e1 / 0.972e3 * t34 + 0.4002424276710846245e-2 * t36 * t40 + t57;
  t61 = 0.1804e1 - 0.646416e0 / t58;
  t65 = my_piecewise3(t2, 0, -0.3e1 / 0.8e1 * t6 * t17 * t18 * t61);
  tzk0 = 0.2e1 * t65;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

}